

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iraffits.c
# Opt level: O0

int irafncmp(char *irafheader,char *teststring,int nc)

{
  int iVar1;
  char *__s1;
  char *line;
  int nc_local;
  char *teststring_local;
  char *irafheader_local;
  
  __s1 = iraf2str(irafheader,nc);
  if (__s1 == (char *)0x0) {
    irafheader_local._4_4_ = 1;
  }
  else {
    iVar1 = strncmp(__s1,teststring,(long)nc);
    if (iVar1 == 0) {
      free(__s1);
      irafheader_local._4_4_ = 0;
    }
    else {
      free(__s1);
      irafheader_local._4_4_ = 1;
    }
  }
  return irafheader_local._4_4_;
}

Assistant:

static int irafncmp (

char	*irafheader,	/* IRAF image header from file */
char	*teststring,	/* C character string to compare */
int	nc)		/* Number of characters to compate */

{
    char *line;

    if ((line = iraf2str (irafheader, nc)) == NULL)
	return (1);
    if (strncmp (line, teststring, nc) == 0) {
	free (line);
	return (0);
	}
    else {
	free (line);
	return (1);
	}
}